

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

int __thiscall
ACSStringPool::FindString(ACSStringPool *this,char *str,size_t len,uint h,uint bucketnum)

{
  PoolEntry *pPVar1;
  uint uVar2;
  PoolEntry *pPVar3;
  char *__s1;
  bool bVar4;
  int iVar5;
  long in_RAX;
  uint uVar6;
  undefined8 uStack_38;
  
  uVar6 = this->PoolBuckets[bucketnum];
  pPVar3 = (this->Pool).Array;
  uStack_38 = in_RAX;
  while( true ) {
    if (uVar6 == 0xffffffff) {
      return -1;
    }
    uVar2 = pPVar3[uVar6].Next;
    if (uVar2 == 0xfffffffe) break;
    pPVar1 = pPVar3 + uVar6;
    if (((pPVar1->Hash == h) && (__s1 = (pPVar1->Str).Chars, *(uint *)(__s1 + -0xc) == len)) &&
       (iVar5 = bcmp(__s1,str,len), iVar5 == 0)) {
      bVar4 = false;
      uStack_38 = (ulong)uVar6 << 0x20;
    }
    else {
      bVar4 = true;
      uVar6 = uVar2;
    }
    if (!bVar4) {
      return uStack_38._4_4_;
    }
  }
  __assert_fail("entry->Next != FREE_ENTRY",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_acs.cpp"
                ,0x289,
                "int ACSStringPool::FindString(const char *, size_t, unsigned int, unsigned int)");
}

Assistant:

int ACSStringPool::FindString(const char *str, size_t len, unsigned int h, unsigned int bucketnum)
{
	unsigned int i = PoolBuckets[bucketnum];
	while (i != NO_ENTRY)
	{
		PoolEntry *entry = &Pool[i];
		assert(entry->Next != FREE_ENTRY);
		if (entry->Hash == h && entry->Str.Len() == len &&
			memcmp(entry->Str.GetChars(), str, len) == 0)
		{
			return i;
		}
		i = entry->Next;
	}
	return -1;
}